

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O0

int tinf_decode_trees(tinf_data *d,tinf_tree *lt,tinf_tree *dt)

{
  uint num_00;
  uint num_01;
  uint uVar1;
  uint uVar2;
  uint local_18c;
  int sym;
  uint clen;
  int res;
  uint length;
  uint num;
  uint i;
  uint hclen;
  uint hdist;
  uint hlit;
  uchar lengths [320];
  tinf_tree *dt_local;
  tinf_tree *lt_local;
  tinf_data *d_local;
  
  lengths._312_8_ = dt;
  num_00 = tinf_getbits_base(d,5,0x101);
  num_01 = tinf_getbits_base(d,5,1);
  uVar1 = tinf_getbits_base(d,4,4);
  if ((num_00 < 0x11f) && (num_01 < 0x1f)) {
    for (length = 0; length < 0x13; length = length + 1) {
      *(undefined1 *)((long)&hdist + (ulong)length) = 0;
    }
    for (length = 0; length < uVar1; length = length + 1) {
      uVar2 = tinf_getbits(d,3);
      *(char *)((long)&hdist + (ulong)"\x10\x11\x12"[length]) = (char)uVar2;
    }
    d_local._4_4_ = tinf_build_tree(lt,(uchar *)&hdist,0x13);
    if (d_local._4_4_ == 0) {
      if (lt->max_sym == -1) {
        d_local._4_4_ = -3;
      }
      else {
        res = 0;
        while ((uint)res < num_00 + num_01) {
          local_18c = tinf_decode_symbol(d,lt);
          if (lt->max_sym < (int)local_18c) {
            return -3;
          }
          if (local_18c == 0x10) {
            if (res == 0) {
              return -3;
            }
            local_18c = (uint)*(byte *)((long)&hdist + (ulong)(res - 1));
            clen = tinf_getbits_base(d,2,3);
          }
          else if (local_18c == 0x11) {
            local_18c = 0;
            clen = tinf_getbits_base(d,3,3);
          }
          else if (local_18c == 0x12) {
            local_18c = 0;
            clen = tinf_getbits_base(d,7,0xb);
          }
          else {
            clen = 1;
          }
          if ((num_00 + num_01) - res < clen) {
            return -3;
          }
          while (clen != 0) {
            *(char *)((long)&hdist + (ulong)(uint)res) = (char)local_18c;
            clen = clen - 1;
            res = res + 1;
          }
        }
        if (lengths[0xf8] == '\0') {
          d_local._4_4_ = -3;
        }
        else {
          d_local._4_4_ = tinf_build_tree(lt,(uchar *)&hdist,num_00);
          if ((d_local._4_4_ == 0) &&
             (d_local._4_4_ =
                   tinf_build_tree((tinf_tree *)lengths._312_8_,
                                   (uchar *)((long)&hdist + (ulong)num_00),num_01),
             d_local._4_4_ == 0)) {
            d_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    d_local._4_4_ = -3;
  }
  return d_local._4_4_;
}

Assistant:

static int tinf_decode_trees(struct tinf_data *d, struct tinf_tree *lt,
                             struct tinf_tree *dt)
{
	unsigned char lengths[288 + 32];

	/* Special ordering of code length codes */
	static const unsigned char clcidx[19] = {
		16, 17, 18, 0,  8, 7,  9, 6, 10, 5,
		11,  4, 12, 3, 13, 2, 14, 1, 15
	};

	unsigned int hlit, hdist, hclen;
	unsigned int i, num, length;
	int res;

	/* Get 5 bits HLIT (257-286) */
	hlit = tinf_getbits_base(d, 5, 257);

	/* Get 5 bits HDIST (1-32) */
	hdist = tinf_getbits_base(d, 5, 1);

	/* Get 4 bits HCLEN (4-19) */
	hclen = tinf_getbits_base(d, 4, 4);

	/*
	 * The RFC limits the range of HLIT to 286, but lists HDIST as range
	 * 1-32, even though distance codes 30 and 31 have no meaning. While
	 * we could allow the full range of HLIT and HDIST to make it possible
	 * to decode the fixed trees with this function, we consider it an
	 * error here.
	 *
	 * See also: https://github.com/madler/zlib/issues/82
	 */
	if (hlit > 286 || hdist > 30) {
		return TINF_DATA_ERROR;
	}

	for (i = 0; i < 19; ++i) {
		lengths[i] = 0;
	}

	/* Read code lengths for code length alphabet */
	for (i = 0; i < hclen; ++i) {
		/* Get 3 bits code length (0-7) */
		unsigned int clen = tinf_getbits(d, 3);

		lengths[clcidx[i]] = clen;
	}

	/* Build code length tree (in literal/length tree to save space) */
	res = tinf_build_tree(lt, lengths, 19);

	if (res != TINF_OK) {
		return res;
	}

	/* Check code length tree is not empty */
	if (lt->max_sym == -1) {
		return TINF_DATA_ERROR;
	}

	/* Decode code lengths for the dynamic trees */
	for (num = 0; num < hlit + hdist; ) {
		int sym = tinf_decode_symbol(d, lt);

		if (sym > lt->max_sym) {
			return TINF_DATA_ERROR;
		}

		switch (sym) {
		case 16:
			/* Copy previous code length 3-6 times (read 2 bits) */
			if (num == 0) {
				return TINF_DATA_ERROR;
			}
			sym = lengths[num - 1];
			length = tinf_getbits_base(d, 2, 3);
			break;
		case 17:
			/* Repeat code length 0 for 3-10 times (read 3 bits) */
			sym = 0;
			length = tinf_getbits_base(d, 3, 3);
			break;
		case 18:
			/* Repeat code length 0 for 11-138 times (read 7 bits) */
			sym = 0;
			length = tinf_getbits_base(d, 7, 11);
			break;
		default:
			/* Values 0-15 represent the actual code lengths */
			length = 1;
			break;
		}

		if (length > hlit + hdist - num) {
			return TINF_DATA_ERROR;
		}

		while (length--) {
			lengths[num++] = sym;
		}
	}

	/* Check EOB symbol is present */
	if (lengths[256] == 0) {
		return TINF_DATA_ERROR;
	}

	/* Build dynamic trees */
	res = tinf_build_tree(lt, lengths, hlit);

	if (res != TINF_OK) {
		return res;
	}

	res = tinf_build_tree(dt, lengths + hlit, hdist);

	if (res != TINF_OK) {
		return res;
	}

	return TINF_OK;
}